

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::ModeState<int,duckdb::ModeStandard<int>>,int,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  unsigned_long uVar7;
  int *piVar8;
  ulong uVar9;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  int *local_f0;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_c0.data = (data_ptr_t)&input->validity;
      local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_c0.sel = (SelectionVector *)aggr_input_data;
      TypedModeFunction<duckdb::ModeStandard<int>>::
      ConstantOperation<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                (*(ModeState<int,_duckdb::ModeStandard<int>_> **)states->data,(int *)input->data,
                 (AggregateUnaryInput *)&local_c0,count);
    }
  }
  else if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
    local_f0 = (int *)input->data;
    pdVar2 = states->data;
    FlatVector::VerifyFlatVector(input);
    if ((input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        iVar6 = 0;
        do {
          BaseModeFunction<duckdb::ModeStandard<int>>::
          Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                    (*(ModeState<int,_duckdb::ModeStandard<int>_> **)(pdVar2 + iVar6 * 8),local_f0,
                     aggr_input_data);
          iVar6 = iVar6 + 1;
          local_f0 = local_f0 + 1;
        } while (count != iVar6);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar3 = 0;
      uVar5 = 0;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar7 = 0xffffffffffffffff;
        }
        else {
          uVar7 = puVar1[uVar3];
        }
        uVar4 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar4 = count;
        }
        uVar9 = uVar4;
        if (uVar7 != 0) {
          uVar9 = uVar5;
          if (uVar7 == 0xffffffffffffffff) {
            if (uVar5 < uVar4) {
              piVar8 = local_f0 + uVar5;
              do {
                BaseModeFunction<duckdb::ModeStandard<int>>::
                Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                          (*(ModeState<int,_duckdb::ModeStandard<int>_> **)(pdVar2 + uVar5 * 8),
                           piVar8,aggr_input_data);
                uVar5 = uVar5 + 1;
                piVar8 = piVar8 + 1;
                uVar9 = uVar5;
              } while (uVar4 != uVar5);
            }
          }
          else if (uVar5 < uVar4) {
            piVar8 = local_f0 + uVar5;
            uVar9 = 0;
            do {
              if ((uVar7 >> (uVar9 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<int>>::
                Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                          (*(ModeState<int,_duckdb::ModeStandard<int>_> **)
                            (pdVar2 + uVar9 * 8 + uVar5 * 8),piVar8,aggr_input_data);
              }
              uVar9 = uVar9 + 1;
              piVar8 = piVar8 + 1;
            } while ((uVar5 - uVar4) + uVar9 != 0);
            uVar9 = uVar5 + uVar9;
          }
        }
        uVar3 = uVar3 + 1;
        uVar5 = uVar9;
      } while (uVar3 != count + 0x3f >> 6);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_c0);
    Vector::ToUnifiedFormat(states,count,&local_78);
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        uVar5 = 0;
        do {
          uVar3 = uVar5;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            uVar3 = (ulong)(local_c0.sel)->sel_vector[uVar5];
          }
          uVar4 = uVar5;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            uVar4 = (ulong)(local_78.sel)->sel_vector[uVar5];
          }
          BaseModeFunction<duckdb::ModeStandard<int>>::
          Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                    (*(ModeState<int,_duckdb::ModeStandard<int>_> **)(local_78.data + uVar4 * 8),
                     (int *)(local_c0.data + uVar3 * 4),aggr_input_data);
          uVar5 = uVar5 + 1;
        } while (count != uVar5);
      }
    }
    else if (count != 0) {
      uVar5 = 0;
      do {
        uVar3 = uVar5;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)(local_c0.sel)->sel_vector[uVar5];
        }
        uVar4 = uVar5;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)(local_78.sel)->sel_vector[uVar5];
        }
        if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6]
             >> (uVar3 & 0x3f) & 1) != 0)) {
          BaseModeFunction<duckdb::ModeStandard<int>>::
          Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
                    (*(ModeState<int,_duckdb::ModeStandard<int>_> **)(local_78.data + uVar4 * 8),
                     (int *)(local_c0.data + uVar3 * 4),aggr_input_data);
        }
        uVar5 = uVar5 + 1;
      } while (count != uVar5);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_c0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}